

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  pointer pcVar1;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  text local_118;
  location local_f8;
  text local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  text local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failed","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_50,local_50 + local_48);
  local_f8.file._M_dataplus._M_p = (pointer)&local_f8.file.field_2;
  pcVar1 = (where_->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,pcVar1 + (where_->file)._M_string_length);
  local_f8.line = where_->line;
  pcVar1 = (expr_->_M_dataplus)._M_p;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + expr_->_M_string_length);
  std::__cxx11::string::append((char *)&local_138);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_138,local_138 + local_130);
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  std::operator+(&local_90,&local_b0,decomposition_);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_138,local_138 + local_130);
  message::message(&this->super_message,&local_118,&local_f8,&local_70,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != &local_f8.file.field_2) {
    operator_delete(local_f8.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  *(undefined ***)&this->super_message = &PTR__message_001b9b90;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message( "failed", where_, expr_ + " for " + decomposition_) {}